

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.cc
# Opt level: O1

char * benchmark::ParseFlagValue(char *str,char *flag,bool def_optional)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  undefined8 *puVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  string flag_str;
  allocator local_81;
  char *local_80;
  size_t local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  ulong *local_40;
  long local_38;
  ulong local_30 [2];
  
  if (flag == (char *)0x0 || str == (char *)0x0) {
    return (char *)0x0;
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"--","");
  std::__cxx11::string::string((string *)&local_60,flag,&local_81);
  uVar7 = 0xf;
  if (local_40 != local_30) {
    uVar7 = local_30[0];
  }
  if (uVar7 < (ulong)(local_58 + local_38)) {
    uVar7 = 0xf;
    if (local_60 != local_50) {
      uVar7 = local_50[0];
    }
    if ((ulong)(local_58 + local_38) <= uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_40);
      goto LAB_0010c476;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_60);
LAB_0010c476:
  local_80 = (char *)&local_70;
  pcVar1 = (char *)(puVar4 + 2);
  if ((char *)*puVar4 == pcVar1) {
    local_70 = *(undefined8 *)pcVar1;
    uStack_68 = puVar4[3];
  }
  else {
    local_70 = *(undefined8 *)pcVar1;
    local_80 = (char *)*puVar4;
  }
  local_78 = puVar4[1];
  *puVar4 = pcVar1;
  puVar4[1] = 0;
  *pcVar1 = '\0';
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  sVar2 = local_78;
  pcVar1 = local_80;
  iVar3 = strncmp(str,local_80,local_78);
  if (iVar3 == 0) {
    pcVar5 = str + sVar2;
    if ((!def_optional) || (pcVar6 = pcVar5, *pcVar5 != '\0')) {
      pcVar6 = (char *)0x0;
      if (*pcVar5 == '=') {
        pcVar6 = pcVar5 + 1;
      }
    }
  }
  else {
    pcVar6 = (char *)0x0;
  }
  if (pcVar1 != (char *)&local_70) {
    operator_delete(pcVar1);
  }
  return pcVar6;
}

Assistant:

const char* ParseFlagValue(const char* str, const char* flag,
                           bool def_optional) {
  // str and flag must not be nullptr.
  if (str == nullptr || flag == nullptr) return nullptr;

  // The flag must start with "--".
  const std::string flag_str = std::string("--") + std::string(flag);
  const size_t flag_len = flag_str.length();
  if (strncmp(str, flag_str.c_str(), flag_len) != 0) return nullptr;

  // Skips the flag name.
  const char* flag_end = str + flag_len;

  // When def_optional is true, it's OK to not have a "=value" part.
  if (def_optional && (flag_end[0] == '\0')) return flag_end;

  // If def_optional is true and there are more characters after the
  // flag name, or if def_optional is false, there must be a '=' after
  // the flag name.
  if (flag_end[0] != '=') return nullptr;

  // Returns the string after "=".
  return flag_end + 1;
}